

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O2

string * pystring::upper(string *__return_storage_ptr__,string *str)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  int __c;
  size_type sVar4;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  sVar1 = __return_storage_ptr__->_M_string_length;
  for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    __c = (int)pcVar2[sVar4];
    iVar3 = ::islower(__c);
    if (iVar3 != 0) {
      iVar3 = toupper(__c);
      pcVar2[sVar4] = (char)iVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string upper( const std::string & str )
    {
        std::string s( str ) ;
        std::string::size_type len = s.size(), i;

        for ( i = 0; i < len; ++i )
        {
            if ( ::islower( s[i] ) ) s[i] = (char) ::toupper( s[i] );
        }

        return s;
    }